

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

ScatterOut * __thiscall
cert::Metal::scatter
          (ScatterOut *__return_storage_ptr__,Metal *this,Vec3 point,Vec3 normal,UV uv,Ray *r_in,
          PRNG *random)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_38;
  float fStack_34;
  
  fVar3 = normal.z;
  fVar2 = (r_in->direction).x;
  fVar6 = (r_in->direction).y;
  fVar4 = (r_in->direction).z;
  dVar1 = sqrt((double)(ulong)(uint)(fVar4 * fVar4 + fVar2 * fVar2 + fVar6 * fVar6));
  fVar6 = SUB84(dVar1,0);
  fVar4 = (r_in->direction).x / fVar6;
  fVar5 = (r_in->direction).y / fVar6;
  fVar6 = (r_in->direction).z / fVar6;
  local_38 = normal.x;
  fStack_34 = normal.y;
  fVar2 = fVar6 * fVar3 + fVar4 * local_38 + fStack_34 * fVar5;
  fVar2 = fVar2 + fVar2;
  fVar4 = fVar4 - local_38 * fVar2;
  fVar5 = fVar5 - fStack_34 * fVar2;
  fVar6 = fVar6 - fVar2 * fVar3;
  __return_storage_ptr__->is_scattered = 0.0 < fVar3 * fVar6 + local_38 * fVar4 + fStack_34 * fVar5;
  (__return_storage_ptr__->attenuation).z = (this->super_Material).albedo.z;
  fVar2 = (this->super_Material).albedo.y;
  (__return_storage_ptr__->attenuation).x = (this->super_Material).albedo.x;
  (__return_storage_ptr__->attenuation).y = fVar2;
  (__return_storage_ptr__->scattered).origin.x = (float)(int)point._0_8_;
  (__return_storage_ptr__->scattered).origin.y = (float)(int)((ulong)point._0_8_ >> 0x20);
  (__return_storage_ptr__->scattered).origin.z = point.z;
  dVar1 = sqrt((double)(ulong)(uint)(fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5));
  fVar2 = SUB84(dVar1,0);
  (__return_storage_ptr__->scattered).direction.x = fVar4 / fVar2;
  (__return_storage_ptr__->scattered).direction.y = fVar5 / fVar2;
  (__return_storage_ptr__->scattered).direction.z = fVar6 / fVar2;
  __return_storage_ptr__->index = -1.0;
  (__return_storage_ptr__->refracted).origin.x = 0.0;
  (__return_storage_ptr__->refracted).origin.y = 0.0;
  (__return_storage_ptr__->refracted).origin.z = 0.0;
  dVar1 = sqrt(5.26354424712089e-315);
  fVar2 = 0.0 / SUB84(dVar1,0);
  (__return_storage_ptr__->refracted).direction.x = 1.0 / SUB84(dVar1,0);
  (__return_storage_ptr__->refracted).direction.y = fVar2;
  (__return_storage_ptr__->refracted).direction.z = fVar2;
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 reflected = reflect (normalize (r_in.direction), normal);
		return { .is_scattered = dot (reflected, normal) > 0.0,
			.attenuation = albedo,
			.scattered = Ray (point, reflected) };
	}